

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O1

void __thiscall
CipherTest_SHA1WithSecretSuffix_Test::TestBody(CipherTest_SHA1WithSecretSuffix_Test *this)

{
  unsigned_long len;
  int iVar1;
  bool bVar2;
  char *message;
  char *in_R9;
  ScopedTrace gtest_trace_557;
  ScopedTrace gtest_trace_555;
  ScopedTrace gtest_trace_551;
  AssertionResult gtest_ar;
  uint8_t computed [20];
  uint8_t expected [20];
  SHA_CTX ctx;
  uint8_t buf [256];
  ScopedTrace local_23b;
  ScopedTrace local_23a;
  ScopedTrace local_239;
  unsigned_long local_238;
  long *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  unsigned_long local_220;
  unsigned_long local_218;
  undefined1 local_210 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  Bytes local_1f0;
  AssertHelper local_1e0;
  long local_1d8 [4];
  long local_1b8 [4];
  SHA_CTX local_198;
  uchar local_138 [264];
  
  RAND_bytes(local_138,0x100);
  local_238 = 0;
  do {
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              (&local_239,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x227,&local_238);
    local_218 = 0;
    do {
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                (&local_23a,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x22b,&local_218);
      local_220 = 0;
      bVar2 = false;
      do {
        testing::ScopedTrace::ScopedTrace<unsigned_long>
                  (&local_23b,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x22d,&local_220);
        SHA1(local_138,local_220 + local_238,(uchar *)local_1b8);
        len = local_220;
        SHA1_Init(&local_198);
        SHA1_Update(&local_198,local_138,local_238);
        iVar1 = EVP_sha1_final_with_secret_suffix
                          ((SHA_CTX *)&local_198,(uint8_t *)local_1d8,local_138 + local_238,len,
                           local_218);
        local_230 = (long *)CONCAT71(local_230._1_7_,iVar1 != 0);
        local_228 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_1f0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_210,(internal *)&local_230,
                     (AssertionResult *)
                     "EVP_sha1_final_with_secret_suffix( &ctx, computed, buf + prefix, secret_len, max_len)"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1e0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x23c,(char *)CONCAT71(local_210._1_7_,local_210[0]));
          testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&local_1f0);
          testing::internal::AssertHelper::~AssertHelper(&local_1e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_210._1_7_,local_210[0]) != &local_200) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_210._1_7_,local_210[0]),
                            local_200._M_allocated_capacity + 1);
          }
          if ((long *)local_1f0.span_.data_ != (long *)0x0) {
            (**(code **)(*(long *)local_1f0.span_.data_ + 8))();
          }
          if (local_228 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_228,local_228);
          }
          testing::ScopedTrace::~ScopedTrace(&local_23b);
LAB_00241a41:
          iVar1 = 1;
          goto LAB_00241a46;
        }
        local_230 = local_1b8;
        local_228 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14;
        local_1f0.span_.data_ = (uchar *)local_1d8;
        local_1f0.span_.size_ = 0x14;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)local_210,"Bytes(expected)","Bytes(computed)",(Bytes *)&local_230,
                   &local_1f0);
        if (local_210[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_230);
          message = "";
          if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message = (local_208->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1f0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x23f,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1f0,(Message *)&local_230);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
          if (local_230 != (long *)0x0) {
            (**(code **)(*local_230 + 8))();
          }
        }
        if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_208,local_208);
        }
        testing::ScopedTrace::~ScopedTrace(&local_23b);
        if (iVar1 == 0) goto LAB_00241a41;
        local_220 = local_220 + 3;
        bVar2 = local_218 < local_220;
      } while (local_220 <= local_218);
      iVar1 = 0;
LAB_00241a46:
      testing::ScopedTrace::~ScopedTrace(&local_23a);
      if (!bVar2) goto LAB_00241a74;
      local_218 = local_218 + 3;
    } while (local_218 < 0xc0);
    iVar1 = 5;
LAB_00241a74:
    testing::ScopedTrace::~ScopedTrace(&local_239);
    if (((iVar1 != 5) && (iVar1 != 0)) || (local_238 = local_238 + 3, 0x3f < local_238)) {
      return;
    }
  } while( true );
}

Assistant:

TEST(CipherTest, SHA1WithSecretSuffix) {
  uint8_t buf[SHA_CBLOCK * 4];
  RAND_bytes(buf, sizeof(buf));
  // Hashing should run in time independent of the bytes.
  CONSTTIME_SECRET(buf, sizeof(buf));

  // Exhaustively testing interesting cases in this function is cubic in the
  // block size, so we test in 3-byte increments.
  constexpr size_t kSkip = 3;
  // This value should be less than 8 to test the edge case when the 8-byte
  // length wraps to the next block.
  static_assert(kSkip < 8, "kSkip is too large");

  // |EVP_sha1_final_with_secret_suffix| is sensitive to the public length of
  // the partial block previously hashed. In TLS, this is the HMAC prefix, the
  // header, and the public minimum padding length.
  for (size_t prefix = 0; prefix < SHA_CBLOCK; prefix += kSkip) {
    SCOPED_TRACE(prefix);
    // The first block is treated differently, so we run with up to three
    // blocks of length variability.
    for (size_t max_len = 0; max_len < 3 * SHA_CBLOCK; max_len += kSkip) {
      SCOPED_TRACE(max_len);
      for (size_t len = 0; len <= max_len; len += kSkip) {
        SCOPED_TRACE(len);

        uint8_t expected[SHA_DIGEST_LENGTH];
        SHA1(buf, prefix + len, expected);
        CONSTTIME_DECLASSIFY(expected, sizeof(expected));

        // Make a copy of the secret length to avoid interfering with the loop.
        size_t secret_len = len;
        CONSTTIME_SECRET(&secret_len, sizeof(secret_len));

        SHA_CTX ctx;
        SHA1_Init(&ctx);
        SHA1_Update(&ctx, buf, prefix);
        uint8_t computed[SHA_DIGEST_LENGTH];
        ASSERT_TRUE(EVP_sha1_final_with_secret_suffix(
            &ctx, computed, buf + prefix, secret_len, max_len));

        CONSTTIME_DECLASSIFY(computed, sizeof(computed));
        EXPECT_EQ(Bytes(expected), Bytes(computed));
      }
    }
  }
}